

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O3

bool bssl::tls13_add_certificate(SSL_HANDSHAKE *hs)

{
  SSL *ssl;
  ssl_credential_st *psVar1;
  ssl_credential_st *this;
  ssl_ctx_st *psVar2;
  CertCompressionAlg *pCVar3;
  SSL_HANDSHAKE_HINTS *pSVar4;
  size_t __n;
  undefined8 __n_00;
  bool bVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  CRYPTO_BUFFER *pCVar9;
  uint8_t *puVar10;
  size_t sVar11;
  ptrdiff_t _Num;
  long lVar12;
  CBB *pCVar13;
  ulong i;
  CBB compressed;
  CBB extensions;
  Array<unsigned_char> msg;
  ScopedCBB cbb;
  CBB certificate_list;
  CBB body_storage;
  CBB leaf;
  CBB CStack_188;
  CBB local_158;
  CBB local_128;
  CBB local_f0;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  
  ssl = hs->ssl;
  psVar1 = (hs->credential)._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
  CBB_zero(&local_f0);
  if ((hs->field_0x6ca & 0x20) == 0) {
    pCVar13 = &local_90;
    bVar5 = (*ssl->method->init_message)(ssl,&local_f0,pCVar13,'\v');
    if (bVar5) {
LAB_0016237f:
      iVar8 = CBB_add_u8(pCVar13,'\0');
      if ((iVar8 == 0) || (iVar8 = CBB_add_u24_length_prefixed(pCVar13,&local_c0), iVar8 == 0)) {
        bVar5 = false;
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                      ,0x1ae);
        goto LAB_00162781;
      }
      this = (hs->credential)._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>
             ._M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
      if (this == (ssl_credential_st *)0x0) {
        bVar5 = ssl_add_message_cbb(ssl,&local_f0);
        goto LAB_00162781;
      }
      bVar5 = ssl_credential_st::UsesX509(this);
      if (!bVar5) {
        __assert_fail("hs->credential->UsesX509()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                      ,0x1b6,"bool bssl::tls13_add_certificate(SSL_HANDSHAKE *)");
      }
      pCVar9 = (CRYPTO_BUFFER *)
               OPENSSL_sk_value((OPENSSL_STACK *)
                                (psVar1->chain)._M_t.
                                super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                ,0);
      iVar8 = CBB_add_u24_length_prefixed(&local_c0,&local_60);
      if (iVar8 != 0) {
        puVar10 = CRYPTO_BUFFER_data(pCVar9);
        sVar11 = CRYPTO_BUFFER_len(pCVar9);
        iVar8 = CBB_add_bytes(&local_60,puVar10,sVar11);
        if ((iVar8 != 0) && (iVar8 = CBB_add_u16_length_prefixed(&local_c0,&local_158), iVar8 != 0))
        {
          cVar6 = (char)*(uint *)&hs->field_0x6c8;
          if (((*(uint *)&hs->field_0x6c8 & 4) != 0) &&
             ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
              *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
               &(psVar1->signed_cert_timestamp_list)._M_t.
                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> !=
              (crypto_buffer_st *)0x0)) {
            iVar8 = CBB_add_u16(&local_158,0x12);
            if ((iVar8 != 0) &&
               (iVar8 = CBB_add_u16_length_prefixed(&local_158,&CStack_188), iVar8 != 0)) {
              puVar10 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                           (psVar1->signed_cert_timestamp_list)._M_t.
                                           super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                          );
              sVar11 = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                         (psVar1->signed_cert_timestamp_list)._M_t.
                                         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                        );
              iVar8 = CBB_add_bytes(&CStack_188,puVar10,sVar11);
              if ((iVar8 != 0) && (iVar8 = CBB_flush(&local_158), iVar8 != 0)) {
                cVar6 = (char)*(undefined4 *)&hs->field_0x6c8;
                goto LAB_001624bb;
              }
            }
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                          ,0x1ca);
            goto LAB_0016277f;
          }
LAB_001624bb:
          if ((cVar6 < '\0') &&
             ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
              *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
               &(psVar1->ocsp_response)._M_t.
                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> !=
              (crypto_buffer_st *)0x0)) {
            iVar8 = CBB_add_u16(&local_158,5);
            if ((iVar8 != 0) &&
               (((iVar8 = CBB_add_u16_length_prefixed(&local_158,&CStack_188), iVar8 != 0 &&
                 (iVar8 = CBB_add_u8(&CStack_188,'\x01'), iVar8 != 0)) &&
                (iVar8 = CBB_add_u24_length_prefixed(&CStack_188,&local_128), iVar8 != 0)))) {
              puVar10 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                           (psVar1->ocsp_response)._M_t.
                                           super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                          );
              sVar11 = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                         (psVar1->ocsp_response)._M_t.
                                         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                        );
              iVar8 = CBB_add_bytes(&local_128,puVar10,sVar11);
              if ((iVar8 != 0) && (iVar8 = CBB_flush(&local_158), iVar8 != 0)) goto LAB_00162563;
            }
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                          ,0x1d9);
            goto LAB_0016277f;
          }
LAB_00162563:
          if (psVar1->type == kDelegated) {
            iVar8 = CBB_add_u16(&local_158,0x22);
            if ((iVar8 != 0) &&
               (iVar8 = CBB_add_u16_length_prefixed(&local_158,&CStack_188), iVar8 != 0)) {
              puVar10 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                           (psVar1->dc)._M_t.
                                           super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                          );
              sVar11 = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                         (psVar1->dc)._M_t.
                                         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                        );
              iVar8 = CBB_add_bytes(&CStack_188,puVar10,sVar11);
              if ((iVar8 != 0) && (iVar8 = CBB_flush(&local_158), iVar8 != 0)) goto LAB_001625d3;
            }
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                          ,0x1e5);
          }
          else {
LAB_001625d3:
            if (((hs->field_0x6cb & 4) == 0) ||
               (((iVar8 = CBB_add_u16(&local_158,0xca34), iVar8 != 0 &&
                 (iVar8 = CBB_add_u16_length_prefixed(&local_158,&CStack_188), iVar8 != 0)) &&
                (iVar8 = CBB_flush(&local_158), iVar8 != 0)))) {
              for (i = 1; sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)
                                                  (psVar1->chain)._M_t.
                                                  super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                                 ), i < sVar11; i = i + 1) {
                pCVar9 = (CRYPTO_BUFFER *)
                         OPENSSL_sk_value((OPENSSL_STACK *)
                                          (psVar1->chain)._M_t.
                                          super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                          ,i);
                iVar8 = CBB_add_u24_length_prefixed(&local_c0,&CStack_188);
                if (iVar8 == 0) {
LAB_00162761:
                  ERR_put_error(0x10,0,0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                ,0x1fb);
                  goto LAB_0016277f;
                }
                puVar10 = CRYPTO_BUFFER_data(pCVar9);
                sVar11 = CRYPTO_BUFFER_len(pCVar9);
                iVar8 = CBB_add_bytes(&CStack_188,puVar10,sVar11);
                if ((iVar8 == 0) || (iVar8 = CBB_add_u16(&local_c0,0), iVar8 == 0))
                goto LAB_00162761;
              }
              if ((hs->field_0x6ca & 0x20) == 0) {
                bVar5 = ssl_add_message_cbb(ssl,&local_f0);
              }
              else {
                local_128.child = (CBB *)0x0;
                local_128._8_8_ = 0;
                bVar5 = CBBFinishArray(&local_f0,(Array<unsigned_char> *)&local_128);
                if (bVar5) {
                  psVar2 = (ssl->ctx)._M_t.
                           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
                  sVar11 = (psVar2->cert_compression_algs).size_;
                  if (sVar11 != 0) {
                    pCVar3 = (psVar2->cert_compression_algs).data_;
                    lVar12 = 0;
                    do {
                      if (*(uint16_t *)((long)&pCVar3->alg_id + lVar12) ==
                          hs->cert_compression_alg_id) {
                        if (*(long *)((long)&pCVar3->compress + lVar12) != 0) {
                          bVar5 = (*ssl->method->init_message)(ssl,&local_f0,&local_90,'\x19');
                          if (((!bVar5) ||
                              (iVar8 = CBB_add_u16(&local_90,hs->cert_compression_alg_id),
                              iVar8 == 0)) ||
                             ((0xffffff < (ulong)local_128._8_8_ ||
                              ((iVar8 = CBB_add_u24(&local_90,local_128._8_4_), iVar8 == 0 ||
                               (iVar8 = CBB_add_u24_length_prefixed(&local_90,&CStack_188),
                               iVar8 == 0)))))) {
                            bVar5 = false;
                            ERR_put_error(0x10,0,0x44,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                          ,0x21f);
                            goto LAB_00162981;
                          }
                          pSVar4 = (hs->hints)._M_t.
                                   super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                   _M_head_impl;
                          if ((pSVar4 == (SSL_HANDSHAKE_HINTS *)0x0) ||
                             ((((((hs->field_0x6ca & 0x10) != 0 ||
                                 (pSVar4->cert_compression_alg_id != hs->cert_compression_alg_id))
                                || (__n = (pSVar4->cert_compression_input).size_,
                                   __n != local_128._8_8_)) ||
                               ((__n != 0 &&
                                (iVar8 = bcmp((pSVar4->cert_compression_input).data_,local_128.child
                                              ,__n), iVar8 != 0)))) ||
                              (sVar11 = (pSVar4->cert_compression_output).size_, sVar11 == 0)))) {
                            iVar8 = (**(code **)((long)&pCVar3->compress + lVar12))
                                              (ssl,&CStack_188,local_128.child,local_128._8_8_);
                            __n_00 = local_128._8_8_;
                            pCVar13 = local_128.child;
                            if (iVar8 == 0) {
                              iVar8 = 0x22f;
                            }
                            else {
                              if ((pSVar4 != (SSL_HANDSHAKE_HINTS *)0x0) &&
                                 ((hs->field_0x6ca & 0x10) != 0)) {
                                pSVar4->cert_compression_alg_id = hs->cert_compression_alg_id;
                                bVar5 = Array<unsigned_char>::InitUninitialized
                                                  (&pSVar4->cert_compression_input,local_128._8_8_);
                                if (bVar5 && __n_00 != 0) {
                                  memmove((pSVar4->cert_compression_input).data_,pCVar13,__n_00);
                                }
                                if (bVar5) {
                                  puVar10 = CBB_data(&CStack_188);
                                  sVar11 = CBB_len(&CStack_188);
                                  bVar5 = Array<unsigned_char>::InitUninitialized
                                                    (&pSVar4->cert_compression_output,sVar11);
                                  if (bVar5 && sVar11 != 0) {
                                    memmove((pSVar4->cert_compression_output).data_,puVar10,sVar11);
                                  }
                                  if (bVar5) goto LAB_001629d9;
                                }
                                bVar5 = false;
                                goto LAB_00162981;
                              }
LAB_001629d9:
                              bVar7 = ssl_add_message_cbb(ssl,&local_f0);
                              iVar8 = 0x23d;
                              bVar5 = true;
                              if (bVar7) goto LAB_00162981;
                            }
                          }
                          else {
                            iVar8 = CBB_add_bytes(&CStack_188,
                                                  (pSVar4->cert_compression_output).data_,sVar11);
                            if (iVar8 != 0) goto LAB_001629d9;
                            iVar8 = 0x22a;
                          }
                          bVar5 = false;
                          ERR_put_error(0x10,0,0x44,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                        ,iVar8);
                          goto LAB_00162981;
                        }
                        break;
                      }
                      lVar12 = lVar12 + 0x18;
                    } while (sVar11 * 0x18 != lVar12);
                  }
                  bVar5 = false;
                  ERR_put_error(0x10,0,0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                ,0x213);
                }
                else {
                  bVar5 = false;
                  ERR_put_error(0x10,0,0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                ,0x206);
                }
LAB_00162981:
                Array<unsigned_char>::~Array((Array<unsigned_char> *)&local_128);
              }
              goto LAB_00162781;
            }
          }
          goto LAB_0016277f;
        }
      }
      bVar5 = false;
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                    ,0x1bd);
      goto LAB_00162781;
    }
  }
  else {
    pCVar13 = &local_f0;
    iVar8 = CBB_init(pCVar13,0x400);
    if (iVar8 != 0) goto LAB_0016237f;
  }
LAB_0016277f:
  bVar5 = false;
LAB_00162781:
  CBB_cleanup(&local_f0);
  return bVar5;
}

Assistant:

bool tls13_add_certificate(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  const SSL_CREDENTIAL *cred = hs->credential.get();

  ScopedCBB cbb;
  CBB *body, body_storage, certificate_list;

  if (hs->cert_compression_negotiated) {
    if (!CBB_init(cbb.get(), 1024)) {
      return false;
    }
    body = cbb.get();
  } else {
    body = &body_storage;
    if (!ssl->method->init_message(ssl, cbb.get(), body, SSL3_MT_CERTIFICATE)) {
      return false;
    }
  }

  if (  // The request context is always empty in the handshake.
      !CBB_add_u8(body, 0) ||
      !CBB_add_u24_length_prefixed(body, &certificate_list)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (hs->credential == nullptr) {
    return ssl_add_message_cbb(ssl, cbb.get());
  }

  assert(hs->credential->UsesX509());
  CRYPTO_BUFFER *leaf_buf = sk_CRYPTO_BUFFER_value(cred->chain.get(), 0);
  CBB leaf, extensions;
  if (!CBB_add_u24_length_prefixed(&certificate_list, &leaf) ||
      !CBB_add_bytes(&leaf, CRYPTO_BUFFER_data(leaf_buf),
                     CRYPTO_BUFFER_len(leaf_buf)) ||
      !CBB_add_u16_length_prefixed(&certificate_list, &extensions)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (hs->scts_requested && cred->signed_cert_timestamp_list != nullptr) {
    CBB contents;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_certificate_timestamp) ||
        !CBB_add_u16_length_prefixed(&extensions, &contents) ||
        !CBB_add_bytes(
            &contents,
            CRYPTO_BUFFER_data(cred->signed_cert_timestamp_list.get()),
            CRYPTO_BUFFER_len(cred->signed_cert_timestamp_list.get())) ||
        !CBB_flush(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (hs->ocsp_stapling_requested && cred->ocsp_response != NULL) {
    CBB contents, ocsp_response;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_status_request) ||
        !CBB_add_u16_length_prefixed(&extensions, &contents) ||
        !CBB_add_u8(&contents, TLSEXT_STATUSTYPE_ocsp) ||
        !CBB_add_u24_length_prefixed(&contents, &ocsp_response) ||
        !CBB_add_bytes(&ocsp_response,
                       CRYPTO_BUFFER_data(cred->ocsp_response.get()),
                       CRYPTO_BUFFER_len(cred->ocsp_response.get())) ||
        !CBB_flush(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (cred->type == SSLCredentialType::kDelegated) {
    CBB child;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_delegated_credential) ||
        !CBB_add_u16_length_prefixed(&extensions, &child) ||
        !CBB_add_bytes(&child, CRYPTO_BUFFER_data(cred->dc.get()),
                       CRYPTO_BUFFER_len(cred->dc.get())) ||
        !CBB_flush(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (hs->matched_peer_trust_anchor) {
    // Let the peer know we matched a requested trust anchor.
    CBB empty_contents;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_trust_anchors) ||        //
        !CBB_add_u16_length_prefixed(&extensions, &empty_contents) ||  //
        !CBB_flush(&extensions)) {
      return false;
    }
  }

  for (size_t i = 1; i < sk_CRYPTO_BUFFER_num(cred->chain.get()); i++) {
    CRYPTO_BUFFER *cert_buf = sk_CRYPTO_BUFFER_value(cred->chain.get(), i);
    CBB child;
    if (!CBB_add_u24_length_prefixed(&certificate_list, &child) ||
        !CBB_add_bytes(&child, CRYPTO_BUFFER_data(cert_buf),
                       CRYPTO_BUFFER_len(cert_buf)) ||
        !CBB_add_u16(&certificate_list, 0 /* no extensions */)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (!hs->cert_compression_negotiated) {
    return ssl_add_message_cbb(ssl, cbb.get());
  }

  Array<uint8_t> msg;
  if (!CBBFinishArray(cbb.get(), &msg)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const CertCompressionAlg *alg = nullptr;
  for (const auto &candidate : ssl->ctx->cert_compression_algs) {
    if (candidate.alg_id == hs->cert_compression_alg_id) {
      alg = &candidate;
      break;
    }
  }

  if (alg == nullptr || alg->compress == nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  CBB compressed;
  body = &body_storage;
  if (!ssl->method->init_message(ssl, cbb.get(), body,
                                 SSL3_MT_COMPRESSED_CERTIFICATE) ||
      !CBB_add_u16(body, hs->cert_compression_alg_id) ||
      msg.size() > (1u << 24) - 1 ||  //
      !CBB_add_u24(body, static_cast<uint32_t>(msg.size())) ||
      !CBB_add_u24_length_prefixed(body, &compressed)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (hints && !hs->hints_requested &&
      hints->cert_compression_alg_id == hs->cert_compression_alg_id &&
      hints->cert_compression_input == Span(msg) &&
      !hints->cert_compression_output.empty()) {
    if (!CBB_add_bytes(&compressed, hints->cert_compression_output.data(),
                       hints->cert_compression_output.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  } else {
    if (!alg->compress(ssl, &compressed, msg.data(), msg.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
    if (hints && hs->hints_requested) {
      hints->cert_compression_alg_id = hs->cert_compression_alg_id;
      if (!hints->cert_compression_input.CopyFrom(msg) ||
          !hints->cert_compression_output.CopyFrom(
              Span(CBB_data(&compressed), CBB_len(&compressed)))) {
        return false;
      }
    }
  }

  if (!ssl_add_message_cbb(ssl, cbb.get())) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  return true;
}